

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O3

char RegexTree::show_control(char c)

{
  byte bVar1;
  
  bVar1 = c - 7;
  if ((bVar1 < 0xb) && ((0x60fU >> (bVar1 & 0x1f) & 1) != 0)) {
    c = (&DAT_00107160)[(uint)bVar1];
  }
  return c;
}

Assistant:

char RegexTree::show_control(char c) {
    switch (c) {
        case STAR:
            return '*';
        case CAT:
            return '~';
        case OR:
            return '|';
        case WILDCARD:
            return '.';
        case BLOCK:
            return 'B';
        case EPSILON:
            return 'e';
        default:
            return c;
    }
}